

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_list.c
# Opt level: O3

REF_STATUS ref_list_push(REF_LIST ref_list,REF_INT last)

{
  uint uVar1;
  REF_INT *__ptr;
  int iVar2;
  
  iVar2 = ref_list->n;
  if (ref_list->max == iVar2) {
    ref_list->max = ref_list->max + 1000;
    fflush(_stdout);
    __ptr = ref_list->value;
    if (0 < (long)ref_list->max) {
      __ptr = (REF_INT *)realloc(__ptr,(long)ref_list->max << 2);
      ref_list->value = __ptr;
    }
    if (__ptr == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list.c",0x52,
             "ref_list_push","realloc ref_list->value NULL");
      uVar1 = ref_list->max;
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)uVar1,
             (long)(int)uVar1,4,(long)(int)uVar1 * 4);
      return 2;
    }
    iVar2 = ref_list->n;
  }
  else {
    __ptr = ref_list->value;
  }
  __ptr[iVar2] = last;
  ref_list->n = ref_list->n + 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_list_push(REF_LIST ref_list, REF_INT last) {
  if (ref_list_max(ref_list) == ref_list_n(ref_list)) {
    ref_list_max(ref_list) += 1000;
    ref_realloc(ref_list->value, ref_list_max(ref_list), REF_INT);
  }

  ref_list->value[ref_list_n(ref_list)] = last;

  ref_list_n(ref_list)++;

  return REF_SUCCESS;
}